

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere_drawing.cpp
# Opt level: O2

void CMU462::Misc::draw_sphere_opengl(Vector3D *p,double r)

{
  char cVar1;
  
  cVar1 = glIsEnabled(0xb50);
  if (cVar1 != '\0') {
    glDisable(0xb50);
    draw_sphere(p,r);
    glEnable(0xb50);
    return;
  }
  draw_sphere(p,r);
  return;
}

Assistant:

void draw_sphere_opengl(const Vector3D& p, double r) {
  if (glIsEnabled(GL_LIGHTING)) {
      glDisable(GL_LIGHTING);
      draw_sphere(p, r);
      glEnable(GL_LIGHTING);
  } else {
    draw_sphere(p, r);
  }
}